

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O1

llb_buildengine_t * llb_buildengine_create(llb_buildengine_delegate_t delegate)

{
  long *plVar1;
  llb_buildengine_t *plVar2;
  undefined8 *puVar3;
  BuildEngine *this;
  pointer __p;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000024;
  undefined8 in_stack_00000028;
  __uniq_ptr_impl<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
  local_20;
  
  plVar2 = (llb_buildengine_t *)operator_new(0x10);
  *(long *)plVar2 = 0;
  *(long *)(plVar2 + 8) = 0;
  puVar3 = (undefined8 *)operator_new(0x38);
  *(undefined4 *)(puVar3 + 2) = in_stack_00000008;
  *(undefined4 *)((long)puVar3 + 0x14) = in_stack_0000000c;
  *(undefined4 *)(puVar3 + 3) = in_stack_00000010;
  *(undefined4 *)((long)puVar3 + 0x1c) = in_stack_00000014;
  *(undefined4 *)(puVar3 + 4) = in_stack_00000018;
  *(undefined4 *)((long)puVar3 + 0x24) = in_stack_0000001c;
  *(undefined4 *)(puVar3 + 5) = in_stack_00000020;
  *(undefined4 *)((long)puVar3 + 0x2c) = in_stack_00000024;
  puVar3[6] = in_stack_00000028;
  *puVar3 = &PTR__CAPIBuildEngineDelegate_00242300;
  puVar3[1] = &PTR__CAPIBuildEngineDelegate_00242380;
  plVar1 = *(long **)plVar2;
  *(undefined8 **)plVar2 = puVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  this = (BuildEngine *)operator_new(8);
  llbuild::core::BuildEngine::BuildEngine(this,*(BuildEngineDelegate **)plVar2);
  local_20._M_t.
  super__Tuple_impl<0UL,_llbuild::core::BuildEngine_*,_std::default_delete<llbuild::core::BuildEngine>_>
  .super__Head_base<0UL,_llbuild::core::BuildEngine_*,_false>._M_head_impl =
       (tuple<llbuild::core::BuildEngine_*,_std::default_delete<llbuild::core::BuildEngine>_>)
       (_Tuple_impl<0UL,_llbuild::core::BuildEngine_*,_std::default_delete<llbuild::core::BuildEngine>_>
        )0x0;
  std::__uniq_ptr_impl<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
  ::reset((__uniq_ptr_impl<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
           *)(plVar2 + 8),this);
  std::unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>::
  ~unique_ptr((unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
               *)&local_20);
  return plVar2;
}

Assistant:

llb_buildengine_t* llb_buildengine_create(llb_buildengine_delegate_t delegate) {
  CAPIBuildEngine* capi_engine = new CAPIBuildEngine;
  capi_engine->delegate = std::unique_ptr<BuildEngineDelegate>(
    new CAPIBuildEngineDelegate(delegate));
  capi_engine->engine = std::unique_ptr<BuildEngine>(
    new BuildEngine(*capi_engine->delegate));
  return (llb_buildengine_t*) capi_engine;
}